

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O1

void __thiscall PFData_test_setData_Test::TestBody(PFData_test_setData_Test *this)

{
  undefined8 *puVar1;
  int iVar2;
  pointer *__ptr;
  char *pcVar3;
  int i;
  long lVar4;
  AssertionResult gtest_ar;
  PFData test_read;
  PFData test;
  double data [24];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_288;
  AssertHelper local_280;
  internal local_278 [8];
  undefined8 *local_270;
  string local_268;
  string local_248;
  PFData local_228;
  PFData local_180;
  double local_d8 [25];
  
  lVar4 = 0;
  memset(&local_180,0,0xa8);
  PFData::PFData(&local_180);
  do {
    iVar2 = rand();
    local_d8[lVar4] = (double)iVar2 / 1000.0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x18);
  PFData::setR(&local_180,1);
  PFData::setQ(&local_180,1);
  PFData::setP(&local_180,1);
  PFData::setDZ(&local_180,1.0);
  PFData::setDY(&local_180,1.0);
  PFData::setDX(&local_180,1.0);
  PFData::setNZ(&local_180,1);
  PFData::setNY(&local_180,4);
  PFData::setNX(&local_180,6);
  PFData::setData(&local_180,local_d8);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"tests/test_write_file_out.pfb","");
  PFData::writeFile(&local_180,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"tests/test_write_file_out.pfb","");
  PFData::PFData(&local_228,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  PFData::loadHeader(&local_228);
  PFData::loadData(&local_228);
  local_288._M_head_impl._0_4_ = 1;
  local_280.data_._0_4_ = PFData::getR(&local_228);
  testing::internal::CmpHelperEQ<int,int>
            (local_278,"1","test_read.getR()",(int *)&local_288,(int *)&local_280);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x29f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  puVar1 = local_270;
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(puVar1);
  }
  local_288._M_head_impl._0_4_ = 1;
  local_280.data_._0_4_ = PFData::getQ(&local_228);
  testing::internal::CmpHelperEQ<int,int>
            (local_278,"1","test_read.getQ()",(int *)&local_288,(int *)&local_280);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2a0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  puVar1 = local_270;
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(puVar1);
  }
  local_288._M_head_impl._0_4_ = 1;
  local_280.data_._0_4_ = PFData::getP(&local_228);
  testing::internal::CmpHelperEQ<int,int>
            (local_278,"1","test_read.getP()",(int *)&local_288,(int *)&local_280);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2a1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  puVar1 = local_270;
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(puVar1);
  }
  local_280.data_._0_4_ = 1;
  local_288._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       PFData::getDZ(&local_228);
  testing::internal::CmpHelperEQ<int,double>
            (local_278,"1","test_read.getDZ()",(int *)&local_280,(double *)&local_288);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2a2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  puVar1 = local_270;
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(puVar1);
  }
  local_280.data_._0_4_ = 1;
  local_288._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       PFData::getDY(&local_228);
  testing::internal::CmpHelperEQ<int,double>
            (local_278,"1","test_read.getDY()",(int *)&local_280,(double *)&local_288);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2a3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  puVar1 = local_270;
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(puVar1);
  }
  local_280.data_._0_4_ = 1;
  local_288._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       PFData::getDX(&local_228);
  testing::internal::CmpHelperEQ<int,double>
            (local_278,"1","test_read.getDX()",(int *)&local_280,(double *)&local_288);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2a4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  puVar1 = local_270;
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(puVar1);
  }
  local_288._M_head_impl._0_4_ = 1;
  local_280.data_._0_4_ = PFData::getNZ(&local_228);
  testing::internal::CmpHelperEQ<int,int>
            (local_278,"1","test_read.getNZ()",(int *)&local_288,(int *)&local_280);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2a5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  puVar1 = local_270;
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(puVar1);
  }
  local_288._M_head_impl._0_4_ = 4;
  local_280.data_._0_4_ = PFData::getNY(&local_228);
  testing::internal::CmpHelperEQ<int,int>
            (local_278,"4","test_read.getNY()",(int *)&local_288,(int *)&local_280);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2a6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  puVar1 = local_270;
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(puVar1);
  }
  local_288._M_head_impl._0_4_ = 6;
  local_280.data_._0_4_ = PFData::getNX(&local_228);
  testing::internal::CmpHelperEQ<int,int>
            (local_278,"6","test_read.getNX()",(int *)&local_288,(int *)&local_280);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2a7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  puVar1 = local_270;
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(puVar1);
  }
  local_280.data_._0_4_ = 0;
  local_288._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       PFData::getZ(&local_228);
  testing::internal::CmpHelperEQ<int,double>
            (local_278,"0","test_read.getZ()",(int *)&local_280,(double *)&local_288);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2a8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  puVar1 = local_270;
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(puVar1);
  }
  local_280.data_._0_4_ = 0;
  local_288._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       PFData::getY(&local_228);
  testing::internal::CmpHelperEQ<int,double>
            (local_278,"0","test_read.getY()",(int *)&local_280,(double *)&local_288);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2a9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  puVar1 = local_270;
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(puVar1);
  }
  local_280.data_._0_4_ = 0;
  local_288._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       PFData::getX(&local_228);
  iVar2 = 0x14e711;
  testing::internal::CmpHelperEQ<int,double>
            (local_278,"0","test_read.getX()",(int *)&local_280,(double *)&local_288);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2aa,pcVar3);
    iVar2 = (int)&local_288;
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  puVar1 = local_270;
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(puVar1);
  }
  PFData::close(&local_228,iVar2);
  PFData::close(&local_180,iVar2);
  local_288._M_head_impl = local_288._M_head_impl & 0xffffffff00000000;
  local_280.data_._0_4_ = remove("tests/test_write_file_out.pfb");
  testing::internal::CmpHelperEQ<int,int>
            (local_278,"0","remove(\"tests/test_write_file_out.pfb\")",(int *)&local_288,
             (int *)&local_280);
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_288);
    if (local_270 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_270;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2ae,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
  }
  if (local_270 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_270 != local_270 + 2) {
      operator_delete((undefined8 *)*local_270);
    }
    operator_delete(local_270);
  }
  PFData::~PFData(&local_228);
  PFData::~PFData(&local_180);
  return;
}

Assistant:

TEST_F(PFData_test, setData){
    PFData test = PFData();
    double data[24];
    for (int i =0; i<24; i++){
        data[i] = (double) rand() / 1000;
    }
    test.setR(1);
    test.setQ(1);
    test.setP(1);
    test.setDZ(1.0);
    test.setDY(1.0);
    test.setDX(1.0);
    test.setNZ(1);
    test.setNY(4);
    test.setNX(6);
    test.setData(data);
    test.writeFile("tests/test_write_file_out.pfb");
    PFData test_read = PFData("tests/test_write_file_out.pfb");
    test_read.loadHeader();
    test_read.loadData();
    EXPECT_EQ(1, test_read.getR());
    EXPECT_EQ(1, test_read.getQ());
    EXPECT_EQ(1, test_read.getP());
    EXPECT_EQ(1, test_read.getDZ());
    EXPECT_EQ(1, test_read.getDY());
    EXPECT_EQ(1, test_read.getDX());
    EXPECT_EQ(1, test_read.getNZ());
    EXPECT_EQ(4, test_read.getNY());
    EXPECT_EQ(6, test_read.getNX());
    EXPECT_EQ(0, test_read.getZ());
    EXPECT_EQ(0, test_read.getY());
    EXPECT_EQ(0, test_read.getX());

    test_read.close();
    test.close();
    ASSERT_EQ(0,remove("tests/test_write_file_out.pfb"));
}